

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMatterMeshless::IntToDescriptor
          (ChMatterMeshless *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  uint uVar1;
  ulong uVar2;
  ChVectorRef local_80;
  VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_68;
  
  for (uVar1 = 0; uVar2 = (ulong)uVar1,
      uVar2 < (ulong)((long)(this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar1 = uVar1 + 1) {
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_68,&v->super_ChVectorDynamic<double>,(ulong)off_v,3);
    ChVariables::Get_qb(&local_80,
                        &(((this->nodes).
                           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar2].
                           super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->variables).super_ChVariables);
    Eigen::internal::
    call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_80,
               &local_68.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>);
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_68,R,(ulong)off_v,3);
    ChVariables::Get_fb(&local_80,
                        &(((this->nodes).
                           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar2].
                           super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->variables).super_ChVariables);
    Eigen::internal::
    call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_80,
               &local_68.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>);
    off_v = off_v + 3;
  }
  return;
}

Assistant:

void ChMatterMeshless::IntToDescriptor(const unsigned int off_v,
                                       const ChStateDelta& v,
                                       const ChVectorDynamic<>& R,
                                       const unsigned int off_L,
                                       const ChVectorDynamic<>& L,
                                       const ChVectorDynamic<>& Qc) {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j]->variables.Get_qb() = v.segment(off_v + 3 * j, 3);
        nodes[j]->variables.Get_fb() = R.segment(off_v + 3 * j, 3);
    }
}